

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

Space KokkosTools::SpaceTimeStack::get_space(SpaceHandle *handle)

{
  int iVar1;
  SpaceHandle *handle_local;
  
  iVar1 = strncmp(handle->name,"Cuda",4);
  if (iVar1 == 0) {
    handle_local._4_4_ = SPACE_CUDA;
  }
  else {
    iVar1 = strncmp(handle->name,"SYCL",4);
    if (iVar1 == 0) {
      handle_local._4_4_ = SPACE_SYCL;
    }
    else {
      iVar1 = strncmp(handle->name,"OpenMPTarget",0xc);
      if (iVar1 == 0) {
        handle_local._4_4_ = SPACE_OMPT;
      }
      else {
        iVar1 = strncmp(handle->name,"HIP",3);
        if (iVar1 == 0) {
          handle_local._4_4_ = SPACE_HIP;
        }
        else {
          iVar1 = strcmp(handle->name,"Host");
          if (iVar1 != 0) {
            abort();
          }
          handle_local._4_4_ = SPACE_HOST;
        }
      }
    }
  }
  return handle_local._4_4_;
}

Assistant:

Space get_space(SpaceHandle const& handle) {
  // check that name starts with "Cuda"
  if (strncmp(handle.name, "Cuda", 4) == 0) return SPACE_CUDA;
  // check that name starts with "SYCL"
  if (strncmp(handle.name, "SYCL", 4) == 0) return SPACE_SYCL;
  // check that name starts with "OpenMPTarget"
  if (strncmp(handle.name, "OpenMPTarget", 12) == 0) return SPACE_OMPT;
  // check that name starts with "HIP"
  if (strncmp(handle.name, "HIP", 3) == 0) return SPACE_HIP;
  if (strcmp(handle.name, "Host") == 0) return SPACE_HOST;

  abort();
  return SPACE_HOST;
}